

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadVRTS(B3DImporter *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  int iVar7;
  float fVar8;
  aiVector3D aVar9;
  aiVector3t<float> local_d8;
  int local_cc;
  float local_c8;
  int j;
  float t [4];
  int i_1;
  Vertex *v;
  int i;
  int v0;
  int n_verts;
  int sz;
  allocator local_31;
  string local_30;
  B3DImporter *local_10;
  B3DImporter *this_local;
  
  local_10 = this;
  iVar3 = ReadInt(this);
  this->_vflags = iVar3;
  iVar3 = ReadInt(this);
  this->_tcsets = iVar3;
  iVar3 = ReadInt(this);
  this->_tcsize = iVar3;
  if ((((-1 < this->_tcsets) && (this->_tcsets < 5)) && (-1 < this->_tcsize)) && (this->_tcsize < 5)
     ) {
    iVar3 = 0;
    if ((this->_vflags & 1U) != 0) {
      iVar3 = 0xc;
    }
    iVar7 = 0;
    if ((this->_vflags & 2U) != 0) {
      iVar7 = 0x10;
    }
    iVar1 = this->_tcsets;
    iVar2 = this->_tcsize;
    uVar4 = ChunkSize(this);
    uVar4 = uVar4 / (uint)(iVar3 + 0xc + iVar7 + iVar1 * iVar2 * 4);
    sVar5 = std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::
            size(&this->_vertices);
    std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::resize
              (&this->_vertices,(long)(int)((int)sVar5 + uVar4));
    for (v._4_4_ = 0; v._4_4_ < (int)uVar4; v._4_4_ = v._4_4_ + 1) {
      pvVar6 = std::
               vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::
               operator[](&this->_vertices,(long)((int)sVar5 + v._4_4_));
      pvVar6->bones[0] = '\0';
      pvVar6->bones[1] = '\0';
      pvVar6->bones[2] = '\0';
      pvVar6->bones[3] = '\0';
      pvVar6->weights[0] = 0.0;
      pvVar6->weights[1] = 0.0;
      pvVar6->weights[2] = 0.0;
      pvVar6->weights[3] = 0.0;
      aVar9 = ReadVec3(this);
      (pvVar6->vertex).x = (float)(int)aVar9._0_8_;
      (pvVar6->vertex).y = (float)(int)((ulong)aVar9._0_8_ >> 0x20);
      (pvVar6->vertex).z = aVar9.z;
      if ((this->_vflags & 1U) != 0) {
        aVar9 = ReadVec3(this);
        (pvVar6->normal).x = (float)(int)aVar9._0_8_;
        (pvVar6->normal).y = (float)(int)((ulong)aVar9._0_8_ >> 0x20);
        (pvVar6->normal).z = aVar9.z;
      }
      if ((this->_vflags & 2U) != 0) {
        ReadQuat(this);
      }
      for (t[3] = 0.0; (int)t[3] < this->_tcsets; t[3] = (float)((int)t[3] + 1)) {
        memset(&local_c8,0,0x10);
        for (local_cc = 0; local_cc < this->_tcsize; local_cc = local_cc + 1) {
          fVar8 = ReadFloat(this);
          (&local_c8)[local_cc] = fVar8;
        }
        j = (int)(1.0 - (float)j);
        if (t[3] == 0.0) {
          aiVector3t<float>::aiVector3t(&local_d8,local_c8,(float)j,t[0]);
          (pvVar6->texcoords).x = local_d8.x;
          (pvVar6->texcoords).y = local_d8.y;
          (pvVar6->texcoords).z = local_d8.z;
        }
      }
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Bad texcoord data",&local_31);
  Fail(this,&local_30);
}

Assistant:

void B3DImporter::ReadVRTS(){
    _vflags=ReadInt();
    _tcsets=ReadInt();
    _tcsize=ReadInt();
    if( _tcsets<0 || _tcsets>4 || _tcsize<0 || _tcsize>4 ){
        Fail( "Bad texcoord data" );
    }

    int sz=12+(_vflags&1?12:0)+(_vflags&2?16:0)+(_tcsets*_tcsize*4);
    int n_verts=ChunkSize()/sz;

    int v0=static_cast<int>(_vertices.size());
    _vertices.resize( v0+n_verts );

    for( int i=0;i<n_verts;++i ){
        Vertex &v=_vertices[v0+i];

        memset( v.bones,0,sizeof(v.bones) );
        memset( v.weights,0,sizeof(v.weights) );

        v.vertex=ReadVec3();

        if( _vflags & 1 ) v.normal=ReadVec3();

        if( _vflags & 2 ) ReadQuat();	//skip v 4bytes...

        for( int i=0;i<_tcsets;++i ){
            float t[4]={0,0,0,0};
            for( int j=0;j<_tcsize;++j ){
                t[j]=ReadFloat();
            }
            t[1]=1-t[1];
            if( !i ) v.texcoords=aiVector3D( t[0],t[1],t[2] );
        }
    }
}